

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

GenericSoundEssenceDescriptor * __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::WriteToTLVSet
          (GenericSoundEssenceDescriptor *this,TLVWriter *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVWriter local_448;
  TLVWriter local_3e0;
  TLVWriter local_378;
  TLVWriter local_310;
  TLVWriter local_2a8;
  TLVWriter local_240;
  TLVWriter local_1d8;
  TLVWriter local_170;
  TLVWriter local_108;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  GenericSoundEssenceDescriptor *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x5fb,
                  "virtual ASDCP::Result_t ASDCP::MXF::GenericSoundEssenceDescriptor::WriteToTLVSet(TLVWriter &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  FileDescriptor::WriteToTLVSet(&this->super_FileDescriptor,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_AudioSamplingRate);
    TLVWriter::WriteObject(&local_a0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_Locked);
    TLVWriter::WriteUi8(&local_108,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<unsigned_char>::empty
                        ((optional_property<unsigned_char> *)((long)&TLVSet[4].m_Lookup + 1)),
     pMVar4 = local_20, !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_AudioRefLevel);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[4].m_Lookup + 1));
    TLVWriter::WriteUi8(&local_170,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<unsigned_char>::empty
                        ((optional_property<unsigned_char> *)((long)&TLVSet[4].m_Lookup + 3)),
     pMVar4 = local_20, !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_ElectroSpatialFormulation);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)((long)&TLVSet[4].m_Lookup + 3));
    TLVWriter::WriteUi8(&local_1d8,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_ChannelCount);
    TLVWriter::WriteUi32(&local_240,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_QuantizationBits);
    TLVWriter::WriteUi32(&local_2a8,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_2a8);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<unsigned_char>::empty
                        ((optional_property<unsigned_char> *)&TLVSet[5].super_MemIOWriter.m_capacity
                        ), pMVar4 = local_20, !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_DialNorm);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)&TLVSet[5].super_MemIOWriter.m_capacity);
    TLVWriter::WriteUi8(&local_310,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_310);
    Kumu::Result_t::~Result_t((Result_t *)&local_310);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_SoundEssenceCoding);
    TLVWriter::WriteObject(&local_378,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_378);
    Kumu::Result_t::~Result_t((Result_t *)&local_378);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<unsigned_char>::empty
                        ((optional_property<unsigned_char> *)
                         &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_right), pMVar4 = local_20, !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_ReferenceAudioAlignmentLevel);
    optional_property<unsigned_char>::get
              ((optional_property<unsigned_char> *)
               &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    TLVWriter::WriteUi8(&local_3e0,pMVar4,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_3e0);
    Kumu::Result_t::~Result_t((Result_t *)&local_3e0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<ASDCP::MXF::Rational>::empty
                        ((optional_property<ASDCP::MXF::Rational> *)
                         &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count),
     !bVar1)) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_ReferenceImageEditRate);
    optional_property<ASDCP::MXF::Rational>::get
              ((optional_property<ASDCP::MXF::Rational> *)
               &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVWriter::WriteObject(&local_448,local_20,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_448);
    Kumu::Result_t::~Result_t((Result_t *)&local_448);
  }
  return this;
}

Assistant:

ASDCP::Result_t
GenericSoundEssenceDescriptor::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = FileDescriptor::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, AudioSamplingRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, Locked));
  if ( ASDCP_SUCCESS(result)  && ! AudioRefLevel.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, AudioRefLevel));
  if ( ASDCP_SUCCESS(result)  && ! ElectroSpatialFormulation.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, ElectroSpatialFormulation));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, ChannelCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, QuantizationBits));
  if ( ASDCP_SUCCESS(result)  && ! DialNorm.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, DialNorm));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, SoundEssenceCoding));
  if ( ASDCP_SUCCESS(result)  && ! ReferenceAudioAlignmentLevel.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, ReferenceAudioAlignmentLevel));
  if ( ASDCP_SUCCESS(result)  && ! ReferenceImageEditRate.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, ReferenceImageEditRate));
  return result;
}